

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

DdNode * Llb_Nonlin4SweepPartitions_rec
                   (DdManager *dd,Aig_Obj_t *pObj,Vec_Int_t *vOrder,Vec_Ptr_t *vRoots)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *vVar;
  DdNode *bPart;
  DdNode *bBdd1;
  DdNode *bBdd0;
  DdNode *bBdd;
  Vec_Ptr_t *vRoots_local;
  Vec_Int_t *vOrder_local;
  Aig_Obj_t *pObj_local;
  DdManager *dd_local;
  
  iVar1 = Aig_ObjIsConst1(pObj);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      if ((pObj->field_5).pData == (void *)0x0) {
        iVar1 = Aig_ObjIsCo(pObj);
        if (iVar1 == 0) {
          pAVar3 = Aig_ObjFanin0(pObj);
          pDVar4 = Llb_Nonlin4SweepPartitions_rec(dd,pAVar3,vOrder,vRoots);
          iVar1 = Aig_ObjFaninC0(pObj);
          pAVar3 = Aig_ObjFanin1(pObj);
          pDVar5 = Llb_Nonlin4SweepPartitions_rec(dd,pAVar3,vOrder,vRoots);
          iVar2 = Aig_ObjFaninC1(pObj);
          pDVar4 = Cudd_bddAnd(dd,(DdNode *)((ulong)pDVar4 ^ (long)iVar1),
                               (DdNode *)((ulong)pDVar5 ^ (long)iVar2));
          Cudd_Ref(pDVar4);
          iVar1 = Llb_ObjBddVar(vOrder,pObj);
          bBdd0 = pDVar4;
          if (-1 < iVar1) {
            iVar1 = Llb_ObjBddVar(vOrder,pObj);
            bBdd0 = Cudd_bddIthVar(dd,iVar1);
            pDVar5 = Cudd_bddXnor(dd,bBdd0,pDVar4);
            Cudd_Ref(pDVar5);
            Vec_PtrPush(vRoots,pDVar5);
            Cudd_RecursiveDeref(dd,pDVar4);
            Cudd_Ref(bBdd0);
          }
          (pObj->field_5).pData = bBdd0;
          dd_local = (DdManager *)bBdd0;
        }
        else {
          pAVar3 = Aig_ObjFanin0(pObj);
          pDVar4 = Llb_Nonlin4SweepPartitions_rec(dd,pAVar3,vOrder,vRoots);
          iVar1 = Aig_ObjFaninC0(pObj);
          iVar2 = Llb_ObjBddVar(vOrder,pObj);
          pDVar5 = Cudd_bddIthVar(dd,iVar2);
          pDVar4 = Cudd_bddXnor(dd,pDVar5,(DdNode *)((ulong)pDVar4 ^ (long)iVar1));
          Cudd_Ref(pDVar4);
          Vec_PtrPush(vRoots,pDVar4);
          dd_local = (DdManager *)0x0;
        }
      }
      else {
        dd_local = (DdManager *)(pObj->field_5).pData;
      }
    }
    else {
      iVar1 = Llb_ObjBddVar(vOrder,pObj);
      dd_local = (DdManager *)Cudd_bddIthVar(dd,iVar1);
    }
  }
  else {
    dd_local = (DdManager *)Cudd_ReadOne(dd);
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Llb_Nonlin4SweepPartitions_rec( DdManager * dd, Aig_Obj_t * pObj, Vec_Int_t * vOrder, Vec_Ptr_t * vRoots )
{
    DdNode * bBdd, * bBdd0, * bBdd1, * bPart, * vVar;
    if ( Aig_ObjIsConst1(pObj) )
        return Cudd_ReadOne(dd); 
    if ( Aig_ObjIsCi(pObj) )
        return Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    if ( pObj->pData )
        return (DdNode *)pObj->pData;
    if ( Aig_ObjIsCo(pObj) )
    {
        bBdd0 = Cudd_NotCond( Llb_Nonlin4SweepPartitions_rec(dd, Aig_ObjFanin0(pObj), vOrder, vRoots), Aig_ObjFaninC0(pObj) );
        bPart = Cudd_bddXnor( dd, Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) ), bBdd0 );  Cudd_Ref( bPart );
        Vec_PtrPush( vRoots, bPart );
        return NULL;
    }
    bBdd0 = Cudd_NotCond( Llb_Nonlin4SweepPartitions_rec(dd, Aig_ObjFanin0(pObj), vOrder, vRoots), Aig_ObjFaninC0(pObj) );
    bBdd1 = Cudd_NotCond( Llb_Nonlin4SweepPartitions_rec(dd, Aig_ObjFanin1(pObj), vOrder, vRoots), Aig_ObjFaninC1(pObj) );
    bBdd  = Cudd_bddAnd( dd, bBdd0, bBdd1 );   Cudd_Ref( bBdd );
    if ( Llb_ObjBddVar(vOrder, pObj) >= 0 )
    {
        vVar  = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
        bPart = Cudd_bddXnor( dd, vVar, bBdd );  Cudd_Ref( bPart );
        Vec_PtrPush( vRoots, bPart );
        Cudd_RecursiveDeref( dd, bBdd );
        bBdd = vVar;  Cudd_Ref( vVar );
    }
    pObj->pData = bBdd;
    return bBdd;
}